

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall QDockWidgetGroupWindow::hasNativeDecos(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  QDockWidget *this_00;
  QWidget *pQVar2;
  
  this_00 = activeTabbedDockWidget(this);
  if (this_00 == (QDockWidget *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = QDockWidgetLayout::wmSupportsNativeWindowDeco();
    if (bVar1) {
      pQVar2 = QDockWidget::titleBarWidget(this_00);
      bVar1 = pQVar2 == (QWidget *)0x0;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool QDockWidgetGroupWindow::hasNativeDecos() const
{
#if QT_CONFIG(tabbar)
    QDockWidget *dw = activeTabbedDockWidget();
    if (!dw) // We have a group of nested QDockWidgets (not just floating tabs)
        return true;

    if (!QDockWidgetLayout::wmSupportsNativeWindowDeco())
        return false;

    return dw->titleBarWidget() == nullptr;
#else
    return true;
#endif
}